

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

ByteMaskType * __thiscall
hexpattern::getbytemask(ByteMaskType *__return_storage_ptr__,hexpattern *this)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  iterator iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  initializer_list<int> __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chunks;
  ByteVector data;
  ByteMaskType binary;
  ByteVector mask;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b0;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a8;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a0;
  set<int,_std::less<int>,_std::allocator<int>_> sizes;
  set<int,_std::less<int>,_std::allocator<int>_> oksizes;
  
  sizes._M_t._M_impl._0_8_ = 0x800000004;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x10;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x20;
  __l._M_len = 4;
  __l._M_array = (iterator)&sizes;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&oksizes,__l,(less<int> *)&binary,(allocator_type *)&chunks);
  getchunks_abi_cxx11_(&chunks,this);
  pbVar3 = chunks.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sizes._M_t._M_impl.super__Rb_tree_header._M_header;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       sizes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sizes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pbVar2 = chunks.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar3; pbVar2 = pbVar2 + 1) {
    binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (undefined4)pbVar2->_M_string_length;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&sizes._M_t,(int *)&binary);
  }
  if (sizes._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&oksizes._M_t,
                       (key_type *)(sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
    ;
    bVar4 = (_Rb_tree_header *)iVar1._M_node != &oksizes._M_t._M_impl.super__Rb_tree_header;
  }
  else {
    bVar4 = false;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pbVar3 = chunks.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != chunks.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    decodechunk(&binary,this,pbVar3);
    if (bVar4) {
      local_a8.current._M_current._4_4_ =
           binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
      local_a8.current._M_current._0_4_ =
           binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
      local_a0.current._M_current =
           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a0,&local_a8);
      local_b0.current._M_current =
           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_b8.current._M_current =
           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&mask,
                 (const_iterator)
                 mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_b0,&local_b8);
    }
    else {
      __first._M_current._4_4_ =
           binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
      __first._M_current._0_4_ =
           binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                 (const_iterator)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,__first,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )binary.first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&mask,
                 (const_iterator)
                 mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )binary.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~pair(&binary);
  }
  std::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
            (__return_storage_ptr__,&data,&mask);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&sizes._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&chunks);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&oksizes._M_t);
  return __return_storage_ptr__;
}

Assistant:

ByteMaskType getbytemask()
    {
        // do a byteswap when the entire pattern consists of 16, 32, 64 or 128 bit chunks.
        std::set<int> oksizes = { 4, 8, 16, 32 };

        auto chunks = getchunks();
        std::set<int> sizes;
        for (auto& c : chunks)
            sizes.insert(c.size());

        bool endianconvert = (sizes.size() == 1) && (oksizes.find(*sizes.begin()) != oksizes.end());

        ByteVector data;
        ByteVector mask;
        for (auto & chunk : chunks) {
            auto binary = decodechunk(chunk);
            if (endianconvert) {
                data.insert(data.end(), binary.first.rbegin(), binary.first.rend());
                mask.insert(mask.end(), binary.second.rbegin(), binary.second.rend());
            }
            else {
                data.insert(data.end(), binary.first.begin(), binary.first.end());
                mask.insert(mask.end(), binary.second.begin(), binary.second.end());
            }
        }

        return std::make_pair(data, mask);
    }